

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void parse_args(LexState *ls,ExpDesc *e)

{
  int line;
  uint uVar1;
  FuncState *fs;
  uint uVar2;
  BCPos BVar3;
  int iVar4;
  anon_union_8_3_2ce71dea_for_u local_40;
  undefined8 local_38;
  undefined4 local_30;
  
  fs = ls->fs;
  iVar4 = ls->tok;
  line = ls->linenumber;
  if (iVar4 == 0x120) {
    local_38 = 0xffffffff00000003;
    local_30 = 0xffffffff;
    local_40.s.aux = 0;
    local_40.s.info = (ls->tokval).u32.lo;
    lj_lex_next(ls);
  }
  else if (iVar4 == 0x7b) {
    expr_table(ls,(ExpDesc *)&local_40.s);
  }
  else {
    if (iVar4 != 0x28) {
      err_syntax(ls,LJ_ERR_XFUNARG);
    }
    if (line != ls->lastline) {
      err_syntax(ls,LJ_ERR_XAMBIG);
    }
    lj_lex_next(ls);
    if (ls->tok == 0x29) {
      local_38 = CONCAT44(local_38._4_4_,0xe);
    }
    else {
      expr_list(ls,(ExpDesc *)&local_40.s);
      if ((int)local_38 == 0xd) {
        *(undefined1 *)((long)&fs->bcbase[(ulong)local_40.sval & 0xffffffff].ins + 3) = 0;
      }
    }
    lex_match(ls,0x29,0x28,line);
  }
  uVar1 = (e->u).s.info;
  if ((int)local_38 != 0xe) {
    if ((int)local_38 == 0xd) {
      iVar4 = ~uVar1 + local_40.s.aux;
      uVar2 = 0x2000041;
      goto LAB_00125e7a;
    }
    expr_tonextreg(fs,(ExpDesc *)&local_40.s);
  }
  iVar4 = fs->freereg - uVar1;
  uVar2 = 0x2000042;
LAB_00125e7a:
  BVar3 = bcemit_INS(fs,iVar4 << 0x10 | uVar1 << 8 | uVar2);
  e->k = VCALL;
  (e->u).s.info = BVar3;
  e->t = 0xffffffff;
  e->f = 0xffffffff;
  (e->u).s.aux = uVar1;
  fs->bcbase[fs->pc - 1].line = line;
  fs->freereg = uVar1 + 1;
  return;
}

Assistant:

static void parse_args(LexState *ls, ExpDesc *e)
{
  FuncState *fs = ls->fs;
  ExpDesc args;
  BCIns ins;
  BCReg base;
  BCLine line = ls->linenumber;
  if (ls->tok == '(') {
#if !LJ_52
    if (line != ls->lastline)
      err_syntax(ls, LJ_ERR_XAMBIG);
#endif
    lj_lex_next(ls);
    if (ls->tok == ')') {  /* f(). */
      args.k = VVOID;
    } else {
      expr_list(ls, &args);
      if (args.k == VCALL)  /* f(a, b, g()) or f(a, b, ...). */
	setbc_b(bcptr(fs, &args), 0);  /* Pass on multiple results. */
    }
    lex_match(ls, ')', '(', line);
  } else if (ls->tok == '{') {
    expr_table(ls, &args);
  } else if (ls->tok == TK_string) {
    expr_init(&args, VKSTR, 0);
    args.u.sval = strV(&ls->tokval);
    lj_lex_next(ls);
  } else {
    err_syntax(ls, LJ_ERR_XFUNARG);
    return;  /* Silence compiler. */
  }
  lj_assertFS(e->k == VNONRELOC, "bad expr type %d", e->k);
  base = e->u.s.info;  /* Base register for call. */
  if (args.k == VCALL) {
    ins = BCINS_ABC(BC_CALLM, base, 2, args.u.s.aux - base - 1 - LJ_FR2);
  } else {
    if (args.k != VVOID)
      expr_tonextreg(fs, &args);
    ins = BCINS_ABC(BC_CALL, base, 2, fs->freereg - base - LJ_FR2);
  }
  expr_init(e, VCALL, bcemit_INS(fs, ins));
  e->u.s.aux = base;
  fs->bcbase[fs->pc - 1].line = line;
  fs->freereg = base+1;  /* Leave one result by default. */
}